

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_partitioned_suite.cpp
# Opt level: O1

void test_array_boolean(void)

{
  size_type in_RCX;
  long lVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  variable data;
  undefined1 local_229;
  basic_variable<std::allocator<char>_> local_228;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined1 local_198 [24];
  undefined1 local_180 [24];
  undefined1 local_168 [24];
  undefined1 local_150 [24];
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  basic_array<std::allocator<char>_> local_a8 [32];
  undefined1 local_88;
  undefined1 local_78;
  undefined1 local_58;
  undefined1 local_48;
  undefined1 local_28;
  
  local_88 = 1;
  local_a8[0] = (basic_array<std::allocator<char>_>)0x1;
  local_58 = 1;
  local_78 = 0;
  local_28 = 1;
  local_48 = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make(&local_228,local_a8,init);
  lVar1 = 0x60;
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_c0,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_d8,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
                          (local_c0,local_d8);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<boolean>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x79,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_d8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_f0,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_108,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
                          (local_f0,local_108);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<integer>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7a,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_108 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_f0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_120,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_138,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                          (local_120,local_138);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7b,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_138 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_120 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_150,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_168,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
                          (local_150,local_168);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7c,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_168 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_150 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_180,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_198,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                          (local_180,local_198);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<wstring>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7d,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_198 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_180 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_1b0,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_1c8,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u16string>>
                          (local_1b0,local_1c8);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u16string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7e,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_1c8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_1b0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_1e0,&local_228,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_1f8,&local_228,false);
  local_a8[0] = (basic_array<std::allocator<char>_>)
                std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u32string>>
                          (local_1e0,local_1f8);
  local_229 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u32string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7f,"void test_array_boolean()",local_a8,&local_229);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_1f8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_1e0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_228);
  return;
}

Assistant:

void test_array_boolean()
{
    variable data = array::make({ true, false, true });
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<boolean>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<integer>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<string>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<wstring>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u16string>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u32string>()), true);
}